

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_program.c
# Opt level: O2

int program_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *upstream)

{
  void *pvVar1;
  size_t __n;
  int iVar2;
  void *__s1;
  int iVar3;
  
  pvVar1 = self->data;
  if (*(size_t *)((long)pvVar1 + 0x18) == 0) {
    iVar3 = 0;
    if (*(int *)((long)pvVar1 + 0x20) == 0) {
      *(undefined4 *)((long)pvVar1 + 0x20) = 1;
      iVar3 = 0x7fffffff;
    }
  }
  else {
    __s1 = __archive_read_filter_ahead(upstream,*(size_t *)((long)pvVar1 + 0x18),(ssize_t *)0x0);
    iVar3 = 0;
    if (__s1 != (void *)0x0) {
      __n = *(size_t *)((long)pvVar1 + 0x18);
      iVar2 = bcmp(__s1,*(void **)((long)pvVar1 + 0x10),__n);
      iVar3 = 0;
      if (iVar2 == 0) {
        iVar3 = (int)__n << 3;
      }
    }
  }
  return iVar3;
}

Assistant:

static int
program_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *upstream)
{
	struct program_bidder *state = self->data;
	const char *p;

	/* If we have a signature, use that to match. */
	if (state->signature_len > 0) {
		p = __archive_read_filter_ahead(upstream,
		    state->signature_len, NULL);
		if (p == NULL)
			return (0);
		/* No match, so don't bid. */
		if (memcmp(p, state->signature, state->signature_len) != 0)
			return (0);
		return ((int)state->signature_len * 8);
	}

	/* Otherwise, bid once and then never bid again. */
	if (state->inhibit)
		return (0);
	state->inhibit = 1;
	return (INT_MAX);
}